

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O3

void __thiscall Scs::Server::Server(Server *this,ServerParams *params)

{
  char *pcVar1;
  size_t sVar2;
  
  (this->super_IServer)._vptr_IServer = (_func_int **)&PTR__Server_0011cb48;
  (this->m_connectionList).
  super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_connectionList;
  (this->m_connectionList).
  super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_connectionList;
  (this->m_connectionList).
  super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_connectionListMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_connectionListMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_connectionListMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_connectionListMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_connectionListMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_listenerSocket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_listenerSocket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_thread)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&this->m_stateCondition);
  memset(&this->m_onStartListening,0,200);
  pcVar1 = (params->port)._M_str;
  sVar2 = (params->port)._M_len;
  (this->m_port)._M_dataplus._M_p = (pointer)&(this->m_port).field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_port,pcVar1,
             pcVar1 + sVar2);
  this->m_maxConnections = params->maxConnections;
  this->m_timeoutMs = (long)(params->timeoutSeconds * 1000.0);
  this->m_maxClientId = 0;
  this->m_status = Initial;
  this->m_shutDown = (__atomic_base<bool>)0x0;
  this->m_error = (__atomic_base<bool>)0x0;
  return;
}

Assistant:

Server::Server(const ServerParams & params) :
	m_port(params.port),
	m_maxConnections(params.maxConnections),
	m_timeoutMs(static_cast<long long>(params.timeoutSeconds * 1000.0))
{
}